

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1535.c
# Opt level: O0

int test(char *URL)

{
  undefined8 uVar1;
  CURLcode CVar2;
  undefined8 uVar3;
  CURLcode ec_1;
  CURLcode ec;
  int res;
  long protocol;
  CURL *dupe;
  CURL *curl;
  char *URL_local;
  
  protocol = 0;
  ec_1 = CURLE_OK;
  curl = (CURL *)URL;
  CVar2 = curl_global_init(3);
  uVar1 = _stderr;
  if (CVar2 != CURLE_OK) {
    uVar3 = curl_easy_strerror(CVar2);
    curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1535.c"
                  ,0x22,CVar2,uVar3);
    ec_1 = CVar2;
  }
  if (ec_1 == CURLE_OK) {
    dupe = (CURL *)curl_easy_init();
    if (dupe == (CURL *)0x0) {
      curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1535.c"
                    ,0x24);
      ec_1 = CURLE_USE_SSL_FAILED|CURLE_PEER_FAILED_VERIFICATION;
    }
    if (ec_1 == CURLE_OK) {
      ec_1 = curl_easy_getinfo(dupe,0x200030,&ec);
      uVar1 = _stderr;
      if (ec_1 == CURLE_OK) {
        if (_ec == 0) {
          CVar2 = curl_easy_setopt(dupe,0x2712,curl);
          uVar1 = _stderr;
          if (CVar2 != CURLE_OK) {
            uVar3 = curl_easy_strerror(CVar2);
            curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1535.c"
                          ,0x36,CVar2,uVar3);
            ec_1 = CVar2;
          }
          if (ec_1 == CURLE_OK) {
            ec_1 = curl_easy_perform(dupe);
            uVar1 = _stderr;
            if (ec_1 == CURLE_OK) {
              ec_1 = curl_easy_getinfo(dupe,0x200030,&ec);
              uVar1 = _stderr;
              if (ec_1 == CURLE_OK) {
                if (_ec == 1) {
                  protocol = curl_easy_duphandle(dupe);
                  if (protocol == 0) {
                    curl_mfprintf(_stderr,"%s:%d curl_easy_duphandle() failed\n",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1535.c"
                                  ,0x56);
                    ec_1 = CURLE_FAILED_INIT;
                  }
                  else {
                    ec_1 = curl_easy_getinfo(protocol,0x200030,&ec);
                    uVar1 = _stderr;
                    if (ec_1 == CURLE_OK) {
                      if (_ec == 0) {
                        curl_easy_reset(dupe);
                        ec_1 = curl_easy_getinfo(dupe,0x200030,&ec);
                        uVar1 = _stderr;
                        if (ec_1 == CURLE_OK) {
                          if (_ec != 0) {
                            curl_mfprintf(_stderr,
                                          "%s:%d protocol init failed; expected 0 but is %ld\n",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1535.c"
                                          ,0x76,_ec);
                            ec_1 = CURLE_FAILED_INIT;
                          }
                        }
                        else {
                          uVar3 = curl_easy_strerror(ec_1);
                          curl_mfprintf(uVar1,"%s:%d curl_easy_getinfo() failed with code %d (%s)\n"
                                        ,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1535.c"
                                        ,0x71,ec_1,uVar3);
                        }
                      }
                      else {
                        curl_mfprintf(_stderr,"%s:%d protocol init failed; expected 0 but is %ld\n",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1535.c"
                                      ,99,_ec);
                        ec_1 = CURLE_FAILED_INIT;
                      }
                    }
                    else {
                      uVar3 = curl_easy_strerror(ec_1);
                      curl_mfprintf(uVar1,"%s:%d curl_easy_getinfo() failed with code %d (%s)\n",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1535.c"
                                    ,0x5e,ec_1,uVar3);
                    }
                  }
                }
                else {
                  curl_mfprintf(_stderr,
                                "%s:%d protocol of http resource is incorrect; expected %d but is %ld\n"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1535.c"
                                ,0x4b,1,_ec);
                  ec_1 = CURLE_HTTP_RETURNED_ERROR;
                }
              }
              else {
                uVar3 = curl_easy_strerror(ec_1);
                curl_mfprintf(uVar1,"%s:%d curl_easy_getinfo() failed with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1535.c"
                              ,0x45,ec_1,uVar3);
              }
            }
            else {
              uVar3 = curl_easy_strerror(ec_1);
              curl_mfprintf(uVar1,"%s:%d curl_easy_perform() failed with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1535.c"
                            ,0x3b,ec_1,uVar3);
            }
          }
        }
        else {
          curl_mfprintf(_stderr,"%s:%d protocol init failed; expected 0 but is %ld\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1535.c"
                        ,0x31,_ec);
          ec_1 = CURLE_FAILED_INIT;
        }
      }
      else {
        uVar3 = curl_easy_strerror(ec_1);
        curl_mfprintf(uVar1,"%s:%d curl_easy_getinfo() failed with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1535.c"
                      ,0x2c,ec_1,uVar3);
      }
    }
    curl_easy_cleanup(dupe);
    curl_easy_cleanup(protocol);
    curl_global_cleanup();
    URL_local._4_4_ = ec_1;
  }
  else {
    URL_local._4_4_ = ec_1;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  CURL *curl, *dupe = NULL;
  long protocol;
  int res = CURLE_OK;

  global_init(CURL_GLOBAL_ALL);

  easy_init(curl);

  /* Test that protocol is properly initialized on curl_easy_init.
  */

  res = curl_easy_getinfo(curl, CURLINFO_PROTOCOL, &protocol);
  if(res) {
    fprintf(stderr, "%s:%d curl_easy_getinfo() failed with code %d (%s)\n",
            __FILE__, __LINE__, res, curl_easy_strerror(res));
    goto test_cleanup;
  }
  if(protocol != 0) {
    fprintf(stderr, "%s:%d protocol init failed; expected 0 but is %ld\n",
            __FILE__, __LINE__, protocol);
    res = CURLE_FAILED_INIT;
    goto test_cleanup;
  }

  easy_setopt(curl, CURLOPT_URL, URL);

  res = curl_easy_perform(curl);
  if(res) {
    fprintf(stderr, "%s:%d curl_easy_perform() failed with code %d (%s)\n",
            __FILE__, __LINE__, res, curl_easy_strerror(res));
    goto test_cleanup;
  }

  /* Test that a protocol is properly set after receiving an HTTP resource.
  */

  res = curl_easy_getinfo(curl, CURLINFO_PROTOCOL, &protocol);
  if(res) {
    fprintf(stderr, "%s:%d curl_easy_getinfo() failed with code %d (%s)\n",
            __FILE__, __LINE__, res, curl_easy_strerror(res));
    goto test_cleanup;
  }
  if(protocol != CURLPROTO_HTTP) {
    fprintf(stderr, "%s:%d protocol of http resource is incorrect; "
            "expected %d but is %ld\n",
            __FILE__, __LINE__, CURLPROTO_HTTP, protocol);
    res = CURLE_HTTP_RETURNED_ERROR;
    goto test_cleanup;
  }

  /* Test that a protocol is properly initialized on curl_easy_duphandle.
  */

  dupe = curl_easy_duphandle(curl);
  if(!dupe) {
    fprintf(stderr, "%s:%d curl_easy_duphandle() failed\n",
            __FILE__, __LINE__);
    res = CURLE_FAILED_INIT;
    goto test_cleanup;
  }

  res = curl_easy_getinfo(dupe, CURLINFO_PROTOCOL, &protocol);
  if(res) {
    fprintf(stderr, "%s:%d curl_easy_getinfo() failed with code %d (%s)\n",
            __FILE__, __LINE__, res, curl_easy_strerror(res));
    goto test_cleanup;
  }
  if(protocol != 0) {
    fprintf(stderr, "%s:%d protocol init failed; expected 0 but is %ld\n",
            __FILE__, __LINE__, protocol);
    res = CURLE_FAILED_INIT;
    goto test_cleanup;
  }


  /* Test that a protocol is properly initialized on curl_easy_reset.
  */

  curl_easy_reset(curl);

  res = curl_easy_getinfo(curl, CURLINFO_PROTOCOL, &protocol);
  if(res) {
    fprintf(stderr, "%s:%d curl_easy_getinfo() failed with code %d (%s)\n",
            __FILE__, __LINE__, res, curl_easy_strerror(res));
    goto test_cleanup;
  }
  if(protocol != 0) {
    fprintf(stderr, "%s:%d protocol init failed; expected 0 but is %ld\n",
            __FILE__, __LINE__, protocol);
    res = CURLE_FAILED_INIT;
    goto test_cleanup;
  }

test_cleanup:
  curl_easy_cleanup(curl);
  curl_easy_cleanup(dupe);
  curl_global_cleanup();
  return res;
}